

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlParserInputBufferPush(void)

{
  int iVar1;
  int iVar2;
  xmlParserInputBufferPtr val;
  char *val_00;
  int local_3c;
  int n_buf;
  char *buf;
  int local_28;
  int n_len;
  int len;
  int n_in;
  xmlParserInputBufferPtr in;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (n_len = 0; n_len < 8; n_len = n_len + 1) {
    for (buf._4_4_ = 0; (int)buf._4_4_ < 4; buf._4_4_ = buf._4_4_ + 1) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlParserInputBufferPtr(n_len,0);
        local_28 = gen_int(buf._4_4_,1);
        val_00 = gen_const_char_ptr(local_3c,2);
        if (val_00 != (char *)0x0) {
          iVar2 = xmlStrlen(val_00);
          if (iVar2 < local_28) {
            local_28 = 0;
          }
        }
        iVar2 = xmlParserInputBufferPush(val,local_28,val_00);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_xmlParserInputBufferPtr(n_len,val,0);
        des_int(buf._4_4_,local_28,1);
        des_const_char_ptr(local_3c,val_00,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlParserInputBufferPush",(ulong)(uint)(iVar2 - iVar1))
          ;
          ret_val = ret_val + 1;
          printf(" %d",(ulong)(uint)n_len);
          printf(" %d",(ulong)buf._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlParserInputBufferPush(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlParserInputBufferPtr in; /* a buffered parser input */
    int n_in;
    int len; /* the size in bytes of the array. */
    int n_len;
    const char * buf; /* an char array */
    int n_buf;

    for (n_in = 0;n_in < gen_nb_xmlParserInputBufferPtr;n_in++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
    for (n_buf = 0;n_buf < gen_nb_const_char_ptr;n_buf++) {
        mem_base = xmlMemBlocks();
        in = gen_xmlParserInputBufferPtr(n_in, 0);
        len = gen_int(n_len, 1);
        buf = gen_const_char_ptr(n_buf, 2);
        if ((buf != NULL) &&
            (len > xmlStrlen(BAD_CAST buf)))
            len = 0;

        ret_val = xmlParserInputBufferPush(in, len, buf);
        desret_int(ret_val);
        call_tests++;
        des_xmlParserInputBufferPtr(n_in, in, 0);
        des_int(n_len, len, 1);
        des_const_char_ptr(n_buf, buf, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlParserInputBufferPush",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_in);
            printf(" %d", n_len);
            printf(" %d", n_buf);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}